

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

Cofaces_simplex_range * __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::cofaces_simplex_range
          (Cofaces_simplex_range *__return_storage_ptr__,
          Simplex_tree<Gudhi::Simplex_tree_options_default> *this,Simplex_handle *simplex,
          int codimension)

{
  undefined4 uVar1;
  bool bVar2;
  size_type sVar3;
  iterator iVar4;
  iterator iVar5;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
  SVar6;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
  __last;
  bool star;
  allocator<int> local_b9;
  Siblings *local_b8;
  Vertex_handle local_b0;
  Siblings *local_a8;
  Vertex_handle local_a0;
  Siblings *local_98;
  Vertex_handle local_90;
  Siblings *local_88;
  Vertex_handle local_80;
  undefined1 local_78 [8];
  vector<int,_std::allocator<int>_> copy;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_50;
  undefined1 local_48 [8];
  Simplex_vertex_range rg;
  int codimension_local;
  Simplex_handle *simplex_local;
  Simplex_tree<Gudhi::Simplex_tree_options_default> *this_local;
  Cofaces_simplex_range *cofaces;
  
  rg.
  super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
  .m_End._12_4_ = codimension;
  if (codimension < 0) {
    __assert_fail("codimension >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/include/gudhi/Simplex_tree.h"
                  ,0x59f,
                  "Cofaces_simplex_range Gudhi::Simplex_tree<>::cofaces_simplex_range(const Simplex_handle, int) const [SimplexTreeOptions = Gudhi::Simplex_tree_options_default]"
                 );
  }
  rg.
  super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
  .m_End.v_._3_1_ = 0;
  std::
  vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
  ::vector(__return_storage_ptr__);
  boost::container::
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  ::vec_iterator(&local_50,simplex);
  simplex_vertex_range((Simplex_vertex_range *)local_48,this,&local_50);
  SVar6 = boost::iterator_range_detail::
          iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
          ::begin((iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
                   *)local_48);
  local_98 = SVar6.sib_;
  local_90 = SVar6.v_;
  local_88 = local_98;
  local_80 = local_90;
  SVar6 = boost::iterator_range_detail::
          iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
          ::end((iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
                 *)local_48);
  local_b8 = SVar6.sib_;
  local_b0 = SVar6.v_;
  local_a8 = local_b8;
  local_a0 = local_b0;
  std::allocator<int>::allocator(&local_b9);
  SVar6.v_ = local_80;
  SVar6.sib_ = local_88;
  __last.v_ = local_a0;
  __last.sib_ = local_a8;
  SVar6._12_4_ = 0;
  __last._12_4_ = 0;
  std::vector<int,std::allocator<int>>::
  vector<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>,void>
            ((vector<int,std::allocator<int>> *)local_78,SVar6,__last,&local_b9);
  std::allocator<int>::~allocator(&local_b9);
  uVar1 = rg.
          super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
          .m_End._12_4_;
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_78);
  if ((uVar1 + (int)sVar3 <= this->dimension_ + 1) &&
     ((rg.
       super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
       .m_End._12_4_ != 0 ||
      (sVar3 = std::vector<int,_std::allocator<int>_>::size
                         ((vector<int,_std::allocator<int>_> *)local_78),
      (int)sVar3 <= this->dimension_)))) {
    iVar4 = std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)local_78);
    iVar5 = std::vector<int,_std::allocator<int>_>::end
                      ((vector<int,_std::allocator<int>_> *)local_78);
    bVar2 = std::
            is_sorted<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::greater<int>>
                      (iVar4._M_current,iVar5._M_current);
    uVar1 = rg.
            super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
            .m_End._12_4_;
    if (!bVar2) {
      __assert_fail("std::is_sorted(copy.begin(), copy.end(), std::greater<Vertex_handle>())",
                    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/include/gudhi/Simplex_tree.h"
                    ,0x5b3,
                    "Cofaces_simplex_range Gudhi::Simplex_tree<>::cofaces_simplex_range(const Simplex_handle, int) const [SimplexTreeOptions = Gudhi::Simplex_tree_options_default]"
                   );
    }
    bVar2 = rg.
            super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
            .m_End._12_4_ == 0;
    sVar3 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_78);
    rec_coface(this,(vector<int,_std::allocator<int>_> *)local_78,&this->root_,1,
               __return_storage_ptr__,bVar2,uVar1 + (int)sVar3);
  }
  rg.
  super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
  .m_End.v_._3_1_ = 1;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_78);
  if ((rg.
       super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
       .m_End.v_._3_1_ & 1) == 0) {
    std::
    vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Cofaces_simplex_range cofaces_simplex_range(const Simplex_handle simplex, int codimension) const{
    // codimension must be positive or null integer
    assert(codimension >= 0);

    if constexpr (Options::link_nodes_by_label) {
      Simplex_vertex_range rg = simplex_vertex_range(simplex);
      Static_vertex_vector simp(rg.begin(), rg.end());
      // must be sorted in decreasing order
      assert(std::is_sorted(simp.begin(), simp.end(), std::greater<Vertex_handle>()));
      auto range = Optimized_star_simplex_range(Optimized_star_simplex_iterator(this, std::move(simp)),
                                                Optimized_star_simplex_iterator());
      // Lazy filtered range
      Fast_cofaces_predicate select(this, codimension, this->dimension(simplex));
      return boost::adaptors::filter(range, select);
    } else {
      Cofaces_simplex_range cofaces;
      Simplex_vertex_range rg = simplex_vertex_range(simplex);
      std::vector<Vertex_handle> copy(rg.begin(), rg.end());
      if (codimension + static_cast<int>(copy.size()) > dimension_ + 1 ||
          (codimension == 0 && static_cast<int>(copy.size()) > dimension_))  // n+codimension greater than dimension_
        return cofaces;
      // must be sorted in decreasing order
      assert(std::is_sorted(copy.begin(), copy.end(), std::greater<Vertex_handle>()));
      bool star = codimension == 0;
      rec_coface(copy, &root_, 1, cofaces, star, codimension + static_cast<int>(copy.size()));
      return cofaces;
    }
  }